

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void __thiscall QPDF::calculateHPageOffset(QPDF *this,NewObjTable *new_obj,ObjTable *obj)

{
  int iVar1;
  QPDFObjectHandle *this_00;
  QPDFObjectHandle *pQVar2;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var3;
  pointer pQVar4;
  long lVar5;
  iterator iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar10;
  Object *pOVar11;
  NewObject *this_01;
  qpdf_offset_t qVar12;
  ulong uVar13;
  long lVar14;
  int *__args;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  pointer pCVar22;
  int local_e4;
  int local_d8;
  allocator_type local_d1;
  long local_d0;
  ulong local_c8;
  Members *local_c0;
  ObjTable *local_b8;
  ObjTable<QPDFWriter::NewObject> *local_b0;
  QPDF *local_a8;
  int local_9c;
  undefined1 local_98 [40];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_70;
  QPDFObjectHandle local_68;
  QPDFObjectHandle *local_58;
  QPDFObjectHandle *local_50;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> local_48;
  
  local_b8 = obj;
  local_b0 = &new_obj->super_ObjTable<QPDFWriter::NewObject>;
  pvVar10 = getAllPages(this);
  local_c0 = (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  pCVar22 = *(pointer *)&(local_c0->c_page_offset_data).entries;
  if (*(pointer *)((long)&local_c0->c_page_offset_data + 8) != pCVar22) {
    this_00 = (pvVar10->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pQVar2 = (pvVar10->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar13 = (long)pQVar2 - (long)this_00 >> 4;
    local_c8 = uVar13;
    if (pQVar2 == this_00) {
      uVar18 = 0;
      goto LAB_0021cacc;
    }
    iVar21 = pCVar22->nobjects;
    local_70 = pvVar10;
    iVar7 = QPDFObjectHandle::getObjectID(this_00);
    local_e4 = outputLengthNextN(this,iVar7,iVar21,(NewObjTable *)local_b0,local_b8);
    pCVar22 = *(pointer *)
               &(local_c0->c_page_offset_data).entries.
                super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                ._M_impl;
    if (*(pointer *)
         ((long)&(local_c0->c_page_offset_data).entries.
                 super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
         + 8) != pCVar22) {
      local_d8 = pCVar22->nshared_objects;
      _Var3._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_a8 = this;
      std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::vector
                (&local_48,local_c8,&local_d1);
      local_98._0_8_ =
           *(undefined8 *)
            &((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
             ((long)&(_Var3._M_head_impl)->page_offset_hints + 0x40))->
             super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>;
      local_98._8_8_ = *(pointer *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x48);
      local_98._16_8_ = *(pointer *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x50);
      *(pointer *)
       &((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
        ((long)&(_Var3._M_head_impl)->page_offset_hints + 0x40))->
        super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> =
           local_48.
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x48) =
           local_48.
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x50) =
           local_48.
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::~vector
                ((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)local_98
                );
      std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::~vector
                (&local_48);
      local_d0 = CONCAT44(local_d0._4_4_,local_e4);
      iVar7 = iVar21;
      local_58 = pQVar2;
      local_50 = this_00;
      if (pQVar2 != this_00) {
        uVar13 = 1;
        uVar18 = 0;
        do {
          uVar20 = uVar13;
          pCVar22 = (local_c0->c_page_offset_data).entries.
                    super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = (long)(local_c0->c_page_offset_data).entries.
                         super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar22 >> 5;
          if (uVar13 <= uVar18) goto LAB_0021cacc;
          pQVar4 = (local_70->
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar13 = (long)(local_70->
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pQVar4 >> 4;
          if (uVar13 <= uVar18) goto LAB_0021cacc;
          iVar9 = pCVar22[uVar18].nobjects;
          iVar8 = QPDFObjectHandle::getObjectID(pQVar4 + uVar18);
          iVar8 = outputLengthNextN(local_a8,iVar8,iVar9,(NewObjTable *)local_b0,local_b8);
          pCVar22 = (local_c0->c_page_offset_data).entries.
                    super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = (long)(local_c0->c_page_offset_data).entries.
                         super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar22 >> 5;
          if (uVar13 <= uVar18) goto LAB_0021cacc;
          lVar19 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                               *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x40))->
                             super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
          ;
          uVar13 = ((long)*(pointer *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x48) -
                    lVar19 >> 3) * 0x2e8ba2e8ba2e8ba3;
          if (uVar13 < uVar18 || uVar13 - uVar18 == 0) goto LAB_0021cacc;
          iVar1 = pCVar22[uVar18].nshared_objects;
          if (local_d8 <= iVar1) {
            local_d8 = iVar1;
          }
          if (local_e4 <= iVar8) {
            local_e4 = iVar8;
          }
          iVar16 = (int)local_d0;
          if (iVar8 < (int)local_d0) {
            iVar16 = iVar8;
          }
          local_d0 = CONCAT44(local_d0._4_4_,iVar16);
          if (iVar7 <= iVar9) {
            iVar7 = iVar9;
          }
          if (iVar9 < iVar21) {
            iVar21 = iVar9;
          }
          lVar17 = uVar18 * 0x58;
          *(int *)(lVar19 + lVar17) = iVar9;
          *(long *)(lVar19 + 8 + lVar17) = (long)iVar8;
          *(int *)(lVar19 + 0x10 + lVar17) = iVar1;
          uVar13 = (ulong)((int)uVar20 + 1);
          uVar18 = uVar20;
        } while (uVar20 < local_c8);
      }
      ((_Var3._M_head_impl)->page_offset_hints).min_nobjects = iVar21;
      pQVar4 = (local_70->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((local_70->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
          _M_impl.super__Vector_impl_data._M_finish != pQVar4) {
        local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (pQVar4->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (pQVar4->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_68.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_68.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_68.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_68.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        iVar9 = QPDFObjectHandle::getObjectID(&local_68);
        pOVar11 = ObjTable<QPDFWriter::Object>::element
                            (&local_b8->super_ObjTable<QPDFWriter::Object>,(long)iVar9);
        this_01 = ObjTable<QPDFWriter::NewObject>::element(local_b0,(long)pOVar11->renumber);
        qVar12 = QPDFXRefEntry::getOffset(&this_01->xref);
        *(qpdf_offset_t *)((long)&(_Var3._M_head_impl)->page_offset_hints + 8) = qVar12;
        if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        iVar7 = nbits(iVar7 - iVar21);
        *(int *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x10) = iVar7;
        iVar7 = (int)local_d0;
        *(int *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x14) = (int)local_d0;
        iVar9 = nbits(local_e4 - (int)local_d0);
        *(int *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x18) = iVar9;
        iVar8 = nbits(local_d8);
        *(int *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x2c) = iVar8;
        iVar8 = nbits(*(int *)((long)&((local_a8->m)._M_t.
                                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->c_shared_object_data + 8));
        *(int *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x30) = iVar8;
        *(int *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x38) = 4;
        *(int *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x28) = iVar9;
        *(int *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x24) = iVar7;
        if (local_58 != local_50) {
          local_d0 = (long)iVar7;
          local_c8 = local_c8 + (local_c8 == 0);
          uVar20 = 0;
          local_9c = iVar21;
          do {
            iVar21 = local_9c;
            lVar19 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                                 *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x40))->
                               super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
            ;
            uVar13 = ((long)*(pointer *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x48) -
                      lVar19 >> 3) * 0x2e8ba2e8ba2e8ba3;
            uVar18 = uVar20;
            if (uVar13 < uVar20 || uVar13 - uVar20 == 0) goto LAB_0021cacc;
            lVar17 = uVar20 * 0x58;
            if ((*(int *)(lVar19 + lVar17) < local_9c) ||
               (*(long *)(lVar19 + lVar17 + 8) < local_d0)) {
              local_98._0_8_ = local_98 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_98,
                         "found too small delta nobjects or delta page length while writing linearization data"
                         ,"");
              stopOnError(local_a8,(string *)local_98);
              if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
                operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
              }
            }
            lVar19 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                                 *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x40))->
                               super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
            ;
            uVar13 = ((long)*(pointer *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x48) -
                      lVar19 >> 3) * 0x2e8ba2e8ba2e8ba3;
            if (uVar13 < uVar20 || uVar13 - uVar20 == 0) goto LAB_0021cacc;
            *(int *)(lVar19 + lVar17) = *(int *)(lVar19 + lVar17) - iVar21;
            lVar14 = *(long *)(lVar19 + 8 + lVar17) - local_d0;
            *(long *)(lVar19 + 8 + lVar17) = lVar14;
            *(long *)(lVar19 + 0x50 + lVar17) = lVar14;
            pCVar22 = (local_c0->c_page_offset_data).entries.
                      super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar13 = (long)(local_c0->c_page_offset_data).entries.
                           super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar22 >> 5;
            if (uVar13 <= uVar20) goto LAB_0021cacc;
            lVar19 = 0;
            uVar15 = 0;
            while( true ) {
              if (pCVar22[uVar20].nshared_objects < 0) {
                QIntC::IntConverter<int,_unsigned_long,_true,_false>::error
                          (pCVar22[uVar20].nshared_objects);
              }
              if ((ulong)(long)pCVar22[uVar20].nshared_objects <= uVar15) break;
              lVar14 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                                   *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x40))->
                                 super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
              ;
              uVar13 = ((long)*(pointer *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x48) -
                        lVar14 >> 3) * 0x2e8ba2e8ba2e8ba3;
              uVar18 = uVar20;
              if (uVar13 < uVar20 || uVar13 - uVar20 == 0) goto LAB_0021cacc;
              pCVar22 = (local_c0->c_page_offset_data).entries.
                        super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar13 = (long)(local_c0->c_page_offset_data).entries.
                             super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar22 >> 5;
              if (uVar13 <= uVar20) goto LAB_0021cacc;
              lVar5 = *(long *)&pCVar22[uVar20].shared_identifiers.
                                super__Vector_base<int,_std::allocator<int>_>;
              uVar13 = (long)*(pointer *)
                              ((long)&pCVar22[uVar20].shared_identifiers.
                                      super__Vector_base<int,_std::allocator<int>_> + 8) - lVar5 >>
                       2;
              uVar18 = uVar15;
              if (uVar13 <= uVar15) goto LAB_0021cacc;
              lVar14 = lVar14 + lVar17;
              __args = (int *)(lVar5 + lVar19);
              iVar6._M_current = *(int **)(lVar14 + 0x20);
              if (iVar6._M_current == *(int **)(lVar14 + 0x28)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)(lVar14 + 0x18),iVar6,__args);
              }
              else {
                *iVar6._M_current = *__args;
                *(int **)(lVar14 + 0x20) = iVar6._M_current + 1;
              }
              lVar14 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                                   *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x40))->
                                 super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
              ;
              uVar13 = ((long)*(pointer *)((long)&(_Var3._M_head_impl)->page_offset_hints + 0x48) -
                        lVar14 >> 3) * 0x2e8ba2e8ba2e8ba3;
              uVar18 = uVar20;
              if (uVar13 < uVar20 || uVar13 - uVar20 == 0) goto LAB_0021cacc;
              lVar14 = lVar14 + lVar17;
              local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
              iVar6._M_current = *(int **)(lVar14 + 0x38);
              if (iVar6._M_current == *(int **)(lVar14 + 0x40)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)(lVar14 + 0x30),iVar6,
                           (int *)local_98);
              }
              else {
                *iVar6._M_current = 0;
                *(int **)(lVar14 + 0x38) = iVar6._M_current + 1;
              }
              uVar15 = uVar15 + 1;
              pCVar22 = (local_c0->c_page_offset_data).entries.
                        super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar13 = (long)(local_c0->c_page_offset_data).entries.
                             super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar22 >> 5;
              lVar19 = lVar19 + 4;
              if (uVar13 <= uVar20) goto LAB_0021cacc;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != local_c8);
        }
        return;
      }
    }
  }
  uVar13 = 0;
  uVar18 = 0;
LAB_0021cacc:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar18,
             uVar13);
}

Assistant:

void
QPDF::calculateHPageOffset(QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    // Page Offset Hint Table

    // We are purposely leaving some values set to their initial zero values.

    std::vector<QPDFObjectHandle> const& pages = getAllPages();
    size_t npages = pages.size();
    CHPageOffset& cph = m->c_page_offset_data;
    std::vector<CHPageOffsetEntry>& cphe = cph.entries;

    // Calculate minimum and maximum values for number of objects per page and page length.

    int min_nobjects = cphe.at(0).nobjects;
    int max_nobjects = min_nobjects;
    int min_length = outputLengthNextN(pages.at(0).getObjectID(), min_nobjects, new_obj, obj);
    int max_length = min_length;
    int max_shared = cphe.at(0).nshared_objects;

    HPageOffset& ph = m->page_offset_hints;
    std::vector<HPageOffsetEntry>& phe = ph.entries;
    // npages is the size of the existing pages array.
    phe = std::vector<HPageOffsetEntry>(npages);

    for (unsigned int i = 0; i < npages; ++i) {
        // Calculate values for each page, assigning full values to the delta items.  They will be
        // adjusted later.

        // Repeat calculations for page 0 so we can assign to phe[i] without duplicating those
        // assignments.

        int nobjects = cphe.at(i).nobjects;
        int length = outputLengthNextN(pages.at(i).getObjectID(), nobjects, new_obj, obj);
        int nshared = cphe.at(i).nshared_objects;

        min_nobjects = std::min(min_nobjects, nobjects);
        max_nobjects = std::max(max_nobjects, nobjects);
        min_length = std::min(min_length, length);
        max_length = std::max(max_length, length);
        max_shared = std::max(max_shared, nshared);

        phe.at(i).delta_nobjects = nobjects;
        phe.at(i).delta_page_length = length;
        phe.at(i).nshared_objects = nshared;
    }

    ph.min_nobjects = min_nobjects;
    ph.first_page_offset = new_obj[obj[pages.at(0)].renumber].xref.getOffset();
    ph.nbits_delta_nobjects = nbits(max_nobjects - min_nobjects);
    ph.min_page_length = min_length;
    ph.nbits_delta_page_length = nbits(max_length - min_length);
    ph.nbits_nshared_objects = nbits(max_shared);
    ph.nbits_shared_identifier = nbits(m->c_shared_object_data.nshared_total);
    ph.shared_denominator = 4; // doesn't matter

    // It isn't clear how to compute content offset and content length.  Since we are not
    // interleaving page objects with the content stream, we'll use the same values for content
    // length as page length.  We will use 0 as content offset because this is what Adobe does
    // (implementation note 127) and pdlin as well.
    ph.nbits_delta_content_length = ph.nbits_delta_page_length;
    ph.min_content_length = ph.min_page_length;

    for (size_t i = 0; i < npages; ++i) {
        // Adjust delta entries
        if ((phe.at(i).delta_nobjects < min_nobjects) ||
            (phe.at(i).delta_page_length < min_length)) {
            stopOnError(
                "found too small delta nobjects or delta page length while writing "
                "linearization data");
        }
        phe.at(i).delta_nobjects -= min_nobjects;
        phe.at(i).delta_page_length -= min_length;
        phe.at(i).delta_content_length = phe.at(i).delta_page_length;

        for (size_t j = 0; j < toS(cphe.at(i).nshared_objects); ++j) {
            phe.at(i).shared_identifiers.push_back(cphe.at(i).shared_identifiers.at(j));
            phe.at(i).shared_numerators.push_back(0);
        }
    }
}